

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

bool __thiscall LexicalAnalyzer::isCorrectVariable(LexicalAnalyzer *this,string *str)

{
  byte bVar1;
  pointer pcVar2;
  byte bVar3;
  bool bVar4;
  string local_68;
  string local_48;
  
  pcVar2 = (str->_M_dataplus)._M_p;
  bVar1 = pcVar2[this->index];
  bVar3 = bVar1 - 0x30;
  if ((9 < bVar3) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
    if (0x3c < bVar1 - 0x23) {
      return false;
    }
    if ((0x1000000000000003U >> ((ulong)(bVar1 - 0x23) & 0x3f) & 1) == 0) {
      return false;
    }
  }
  bVar4 = 1 < (byte)(bVar1 - 0x23);
  if (bVar4 && 9 < bVar3) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar2,pcVar2 + str->_M_string_length);
    endVariable(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->m_DefinedVariables,&this->variable);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_pairErrors,0,(char *)(this->m_pairErrors).first._M_string_length,
               0x1062a5);
    pcVar2 = (str->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + str->_M_string_length);
    endVariable(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&(this->m_pairErrors).second);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->m_vecErrors,&this->m_pairErrors);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->variable,0,(char *)(this->variable)._M_string_length,0x106280);
  this->m_token = VARIABLE;
  return bVar4 && 9 < bVar3;
}

Assistant:

bool LexicalAnalyzer::isCorrectVariable(string str) {
    int ch = str[index];
    if (((ch >= 65) && (ch <= 90)) || ((ch >= 97) && (ch <= 122)) || ((ch >= 48) && (ch <= 57)) || (ch == '#') ||
        (ch == '_') || (ch == '$')) {
        if (((ch == '#') || (ch == '$')) || ((ch >= 48) && (ch <= 57))) {

            m_pairErrors.first = "Invalid syntax. It doesn't match to C++ variable";
            endVariable(str);
            m_pairErrors.second = variable;
            m_vecErrors.push_back(m_pairErrors);
            variable="";
            m_token = VARIABLE;
            return false;
        }
        else{
            endVariable(str);
            m_DefinedVariables.push_back(variable);
            variable ="";
            m_token = VARIABLE;
            return true;
        }
    }
    return false;
}